

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdbloom.cc
# Opt level: O2

string * __thiscall
bloomFilter::getFilter_abi_cxx11_(string *__return_storage_ptr__,bloomFilter *this)

{
  pointer puVar1;
  void *__ptr;
  ostream *poVar2;
  long lVar3;
  ulong uVar4;
  uint uVar5;
  char *pcVar6;
  byte bVar7;
  int i;
  ulong __size;
  
  uVar5 = (uint)((this->mFilterBits & 7) != 0) + (this->mFilterBits >> 3);
  if (uVar5 == 0) {
    poVar2 = (ostream *)&std::cerr;
    pcVar6 = "(EE) Error. Cannot allocate memory for 0 byte in ";
  }
  else {
    __size = (ulong)uVar5;
    __ptr = malloc(__size);
    if (__ptr != (void *)0x0) {
      puVar1 = (this->mBits).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start;
      for (uVar4 = 0; uVar4 != __size; uVar4 = uVar4 + 1) {
        *(undefined1 *)((long)__ptr + uVar4) = 0;
        bVar7 = 0;
        for (lVar3 = 0; lVar3 != 8; lVar3 = lVar3 + 1) {
          if (puVar1[lVar3 + (ulong)(uint)((int)uVar4 * 8)] != '\0') {
            bVar7 = bVar7 | (byte)(1 << ((byte)lVar3 & 0x1f));
            *(byte *)((long)__ptr + uVar4) = bVar7;
          }
        }
      }
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
      for (uVar4 = 0; __size != uVar4; uVar4 = uVar4 + 1) {
        bd_sprintf_append(__return_storage_ptr__,"%02lx",(ulong)*(byte *)((long)__ptr + uVar4));
      }
      free(__ptr);
      return __return_storage_ptr__;
    }
    poVar2 = std::operator<<((ostream *)&std::cerr,"(EE) Error. Cannot allocate memory for ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,uVar5);
    pcVar6 = " bytes in ";
  }
  poVar2 = std::operator<<(poVar2,pcVar6);
  poVar2 = std::operator<<(poVar2,"std::string bloomFilter::getFilter()");
  std::endl<char,std::char_traits<char>>(poVar2);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

std::string bloomFilter::getFilter() {
	/* extract filter as a hex string */
	int bytes = (mFilterBits / BITS_PER_BYTE);
	if (mFilterBits % BITS_PER_BYTE) {
		bytes++;
	}

	if (bytes==0) {
		std::cerr << "(EE) Error. Cannot allocate memory for 0 byte in " << __PRETTY_FUNCTION__ << std::endl;
		return std::string();
	}
	// convert to binary array.
	uint8_t *tmparray = (uint8_t *) malloc(bytes);
    
    	if (tmparray == NULL) {
            std::cerr << "(EE) Error. Cannot allocate memory for " << bytes << " bytes in " << __PRETTY_FUNCTION__ << std::endl;
            return std::string();
        }
        
	int i,j;
	
	for (i = 0; i < bytes; i++) {
		tmparray[i] = 0;
		for (j = 0; j < BITS_PER_BYTE; j++) {
			int bit = i * BITS_PER_BYTE + j;
			if (mBits[bit]) {
				tmparray[i] |= (1 << j);
			}
		}
	}

	std::string out;
	for (int i = 0; i < bytes; i++) {
		bd_sprintf_append(out, "%02lx",  (uint32_t) (tmparray)[i]);
	}

	free(tmparray);

	return out;
}